

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cauchy_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::cauchy_dist<long_double>::operator()(cauchy_dist<long_double> *this,lcg64_shift *r)

{
  undefined1 x [16];
  result_type_conflict3 *prVar1;
  undefined8 in_stack_00000028;
  cauchy_dist<long_double> *in_stack_00000030;
  
  utility::uniformoo<long_double,trng::lcg64_shift>((lcg64_shift *)0x36c3e2);
  x._8_8_ = in_stack_00000028;
  x._0_8_ = this;
  prVar1 = icdf_(in_stack_00000030,(result_type_conflict3)x);
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformoo<result_type>(r));
    }